

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BubbleJson.cpp
# Opt level: O3

void __thiscall
bubbleJson::BubbleJson::StringifyArray
          (BubbleJson *this,BubbleValue *value,StringifyTypes stringifyType,int tabCount)

{
  int tabCount_00;
  char *pcVar1;
  undefined1 *puVar2;
  BubbleValue *value_00;
  int iVar3;
  
  puVar2 = (undefined1 *)ContextPush(this,1);
  *puVar2 = 0x5b;
  tabCount_00 = tabCount + 1;
  pcVar1 = (value->u).string.literal;
  value_00 = *(BubbleValue **)pcVar1;
  do {
    if (stringifyType == StringifyType_Beauty) {
      puVar2 = (undefined1 *)ContextPush(this,1);
      *puVar2 = 10;
      iVar3 = tabCount_00;
      if (-1 < tabCount) {
        do {
          puVar2 = (undefined1 *)ContextPush(this,1);
          *puVar2 = 9;
          iVar3 = iVar3 + -1;
        } while (iVar3 != 0);
      }
      StringifyValue(this,value_00,StringifyType_Beauty,tabCount_00);
      if (value_00 + 1 == *(BubbleValue **)(pcVar1 + 8)) {
        puVar2 = (undefined1 *)ContextPush(this,1);
        *puVar2 = 10;
        if (0 < tabCount) {
          do {
            puVar2 = (undefined1 *)ContextPush(this,1);
            *puVar2 = 9;
            tabCount = tabCount + -1;
          } while (tabCount != 0);
        }
LAB_0010fdc6:
        puVar2 = (undefined1 *)ContextPush(this,1);
        *puVar2 = 0x5d;
        return;
      }
    }
    else {
      StringifyValue(this,value_00,stringifyType,tabCount_00);
      if (value_00 + 1 == *(BubbleValue **)(pcVar1 + 8)) goto LAB_0010fdc6;
    }
    value_00 = value_00 + 1;
    puVar2 = (undefined1 *)ContextPush(this,1);
    *puVar2 = 0x2c;
  } while( true );
}

Assistant:

void BubbleJson::StringifyArray(BubbleValue *value, StringifyTypes stringifyType, int tabCount)
{
    ContextPushChar('[');

    tabCount++;
    auto elements = value->u.array.elements;
    auto it = elements->begin();
    while (true)
    {
        if(stringifyType == StringifyType_Beauty)
        {
            ContextPushChar('\n');
            for (int i = 0; i < tabCount; ++i) { ContextPushChar('\t'); }
        }
        StringifyValue(&*it, stringifyType, tabCount);//weird
        it++;

        //reach the last one
        if(it == elements->end())
            break;
        else
            ContextPushChar(',');
    }

    tabCount--;
    if (stringifyType == StringifyType_Beauty)
    {
        ContextPushChar('\n');
        for (int i = 0; i < tabCount; ++i) { ContextPushChar('\t'); }
    }
    ContextPushChar(']');
}